

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
args::Matcher::GetFlagStrings
          (Matcher *this,string *shortPrefix,string *longPrefix,string *name,string *shortSeparator,
          string *longSeparator)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  reference pvVar2;
  unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_> *in_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000008;
  string *flag_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  char flag;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_> *__range2;
  string bracedname;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *flagStrings;
  unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_>
  *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdf4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  reference local_170;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_168;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_160;
  pointer *local_158;
  undefined1 local_149 [33];
  string local_128 [32];
  string local_108 [32];
  string local_e8 [39];
  char local_c1;
  _Node_iterator_base<char,_false> local_c0;
  _Node_iterator_base<char,_false> local_b8 [2];
  undefined1 local_a5;
  allocator local_91;
  string local_90 [32];
  string local_70 [32];
  string local_50 [56];
  unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_> *local_18;
  
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"[",&local_91);
  std::operator+(in_stack_fffffffffffffdf8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  std::operator+(in_stack_fffffffffffffdf8,
                 (char *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  local_a5 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x1286e1);
  this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)std::unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_>
               ::size((unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_>
                       *)0x1286eb);
  std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::size((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x1286fe);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(in_RSI,(size_type)in_stack_00000008);
  local_b8[0]._M_cur =
       (__node_type *)
       std::unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_>::begin
                 (in_stack_fffffffffffffde8);
  local_c0._M_cur =
       (__node_type *)
       std::unordered_set<char,_std::hash<char>,_std::equal_to<char>,_std::allocator<char>_>::end
                 (in_stack_fffffffffffffde8);
  __lhs = in_stack_00000008;
  while (bVar1 = std::__detail::operator!=(local_b8,&local_c0), bVar1) {
    pvVar2 = std::__detail::_Node_const_iterator<char,_true,_false>::operator*
                       ((_Node_const_iterator<char,_true,_false> *)0x128774);
    local_c1 = *pvVar2;
    in_stack_fffffffffffffdf4 = (int)local_c1;
    in_stack_fffffffffffffdf8 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_149;
    in_stack_fffffffffffffde8 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_149 + 1),1,(char)in_stack_fffffffffffffdf4,
               (allocator *)in_stack_fffffffffffffdf8);
    std::operator+(in_stack_fffffffffffffdf8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    std::operator+(in_stack_fffffffffffffdf8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    std::operator+(in_stack_fffffffffffffdf8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(this_00,in_stack_fffffffffffffdf8);
    std::__cxx11::string::~string(local_e8);
    std::__cxx11::string::~string(local_108);
    std::__cxx11::string::~string(local_128);
    std::__cxx11::string::~string((string *)(local_149 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_149);
    std::__detail::_Node_const_iterator<char,_true,_false>::operator++
              ((_Node_const_iterator<char,_true,_false> *)
               CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  }
  local_158 = &in_RSI[2].
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  local_160._M_cur =
       (__node_type *)
       std::
       unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffde8);
  local_168._M_cur =
       (__node_type *)
       std::
       unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffffde8);
  while (bVar1 = std::__detail::operator!=(&local_160,&local_168), bVar1) {
    local_170 = std::__detail::
                _Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                ::operator*((_Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                             *)0x128a24);
    std::operator+(__lhs,in_RDI);
    std::operator+(in_stack_fffffffffffffdf8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    std::operator+(in_stack_fffffffffffffdf8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(this_00,in_stack_fffffffffffffdf8);
    std::__cxx11::string::~string(local_190);
    std::__cxx11::string::~string(local_1b0);
    std::__cxx11::string::~string(local_1d0);
    std::__detail::
    _Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
    ::operator++((_Node_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                  *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  }
  local_a5 = 1;
  std::__cxx11::string::~string(local_50);
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_RDI;
}

Assistant:

std::vector<std::string> GetFlagStrings(const std::string &shortPrefix, const std::string &longPrefix, const std::string &name, const std::string &shortSeparator, const std::string longSeparator) const
            {
                const std::string bracedname(std::string("[") + name + "]");
                std::vector<std::string> flagStrings;
                flagStrings.reserve(shortFlags.size() + longFlags.size());
                for (const char flag: shortFlags)
                {
                    flagStrings.emplace_back(shortPrefix + std::string(1, flag) + shortSeparator + bracedname);
                }
                for (const std::string &flag: longFlags)
                {
                    flagStrings.emplace_back(longPrefix + flag + longSeparator + bracedname);
                }
                return flagStrings;
            }